

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

void CLI::detail::handle_secondary_array(string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_50;
  size_t ii;
  allocator local_31;
  string local_30 [8];
  string tstr;
  string *str_local;
  
  tstr.field_2._8_8_ = str;
  uVar1 = ::std::__cxx11::string::size();
  if (1 < uVar1) {
    pcVar2 = (char *)::std::__cxx11::string::front();
    if (*pcVar2 == '[') {
      pcVar2 = (char *)::std::__cxx11::string::back();
      if (*pcVar2 == ']') {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_30,"[[",&local_31);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
        local_50 = 1;
        while( true ) {
          uVar1 = ::std::__cxx11::string::size();
          if (uVar1 <= local_50) break;
          ::std::__cxx11::string::operator[](tstr.field_2._8_8_);
          ::std::__cxx11::string::push_back((char)local_30);
          ::std::__cxx11::string::operator[](tstr.field_2._8_8_);
          ::std::__cxx11::string::push_back((char)local_30);
          local_50 = local_50 + 1;
        }
        ::std::__cxx11::string::operator=((string *)tstr.field_2._8_8_,local_30);
        ::std::__cxx11::string::~string(local_30);
      }
    }
  }
  return;
}

Assistant:

CLI11_INLINE void handle_secondary_array(std::string &str) {
    if(str.size() >= 2 && str.front() == '[' && str.back() == ']') {
        // handle some special array processing for arguments if it might be interpreted as a secondary array
        std::string tstr{"[["};
        for(std::size_t ii = 1; ii < str.size(); ++ii) {
            tstr.push_back(str[ii]);
            tstr.push_back(str[ii]);
        }
        str = std::move(tstr);
    }
}